

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_attribute.cc
# Opt level: O0

ValueType __thiscall
draco::PointAttribute::DeduplicateFormattedValues<short,3>
          (PointAttribute *this,GeometryAttribute *in_att,AttributeValueIndex in_att_offset)

{
  bool bVar1;
  uint uVar2;
  array<short,_3UL> aVar3;
  reference pvVar4;
  reference pvVar5;
  pointer ppVar6;
  reference pvVar7;
  size_t sVar8;
  PointAttribute *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<array<unsigned_short,_3UL>,_IndexType<unsigned_int,_AttributeValueIndex_tag_type_>_>_&&>::value,_pair<iterator,_bool>_>
  _Var9;
  PointIndex i_2;
  uint32_t i_1;
  bool inserted;
  iterator it;
  AttributeValueIndex att_pos;
  AttributeValueIndex i;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
  value_map;
  AttributeHashableValue hashable_value;
  AttributeValue att_value;
  ValueToIndexMap value_to_index_map;
  AttributeValueIndex unique_vals;
  PointAttribute *in_stack_fffffffffffffe78;
  PointAttribute *in_stack_fffffffffffffe80;
  pair<std::__detail::_Node_iterator<std::pair<const_std::array<unsigned_short,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_false,_true>,_bool>
  *in_stack_fffffffffffffe88;
  unordered_map<std::array<unsigned_short,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::HashArray<std::array<unsigned_short,_3UL>_>,_std::equal_to<std::array<unsigned_short,_3UL>_>,_std::allocator<std::pair<const_std::array<unsigned_short,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>_>
  *in_stack_fffffffffffffe90;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *in_stack_fffffffffffffea0;
  GeometryAttribute *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  AttributeValueIndex in_stack_fffffffffffffeb4;
  _Node_iterator_base<std::pair<const_std::array<unsigned_short,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_true>
  in_stack_fffffffffffffeb8;
  AttributeValueIndex att_index;
  uint local_110;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> local_10c;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_108;
  uint local_104;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> local_100;
  uint local_fc;
  undefined4 local_f8;
  uint local_f4;
  _Node_iterator_base<std::pair<const_std::array<unsigned_short,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_true>
  local_e0;
  undefined1 local_d8;
  pair<std::array<unsigned_short,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
  local_cc;
  _Node_iterator_base<std::pair<const_std::array<unsigned_short,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_true>
  local_c0;
  undefined1 local_b8;
  byte local_a9;
  uint local_a0;
  undefined4 local_9a;
  short local_96;
  uint local_94;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_90 [10];
  array<unsigned_short,_3UL> local_66;
  undefined4 local_60;
  short local_5c;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_1c [6];
  uint local_4;
  
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(local_1c,0);
  std::
  unordered_map<std::array<unsigned_short,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::HashArray<std::array<unsigned_short,_3UL>_>,_std::equal_to<std::array<unsigned_short,_3UL>_>,_std::allocator<std::pair<const_std::array<unsigned_short,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>_>
  ::unordered_map((unordered_map<std::array<unsigned_short,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::HashArray<std::array<unsigned_short,_3UL>_>,_std::equal_to<std::array<unsigned_short,_3UL>_>,_std::allocator<std::pair<const_std::array<unsigned_short,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>_>
                   *)0x1bd757);
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
  ::IndexTypeVector((IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                     *)CONCAT44(in_stack_fffffffffffffeb4.value_,in_stack_fffffffffffffeb0),
                    (size_t)in_stack_fffffffffffffea8);
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(local_90,0);
  while( true ) {
    att_index.value_ = (uint)((ulong)in_stack_fffffffffffffeb8._M_cur >> 0x20);
    bVar1 = IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator<
                      (local_90,&in_RDI->num_unique_entries_);
    if (!bVar1) break;
    local_a0 = (uint)IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator+
                               ((IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                                in_stack_fffffffffffffe78,
                                (IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                                0x1bd7b7);
    local_94 = local_a0;
    aVar3 = GeometryAttribute::GetValue<short,3>
                      ((GeometryAttribute *)
                       CONCAT44(in_stack_fffffffffffffeb4.value_,in_stack_fffffffffffffeb0),
                       att_index);
    local_9a = aVar3._M_elems._0_4_;
    local_96 = aVar3._M_elems[2];
    local_60 = local_9a;
    local_5c = local_96;
    pvVar4 = std::array<unsigned_short,_3UL>::operator[]
                       ((array<unsigned_short,_3UL> *)in_stack_fffffffffffffe80,
                        (size_type)in_stack_fffffffffffffe78);
    pvVar5 = std::array<short,_3UL>::operator[]
                       ((array<short,_3UL> *)in_stack_fffffffffffffe80,
                        (size_type)in_stack_fffffffffffffe78);
    pvVar4[2] = pvVar5[2];
    *(undefined4 *)pvVar4 = *(undefined4 *)pvVar5;
    std::__detail::
    _Node_iterator<std::pair<const_std::array<unsigned_short,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_false,_true>
    ::_Node_iterator((_Node_iterator<std::pair<const_std::array<unsigned_short,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_false,_true>
                      *)0x1bd877);
    std::
    pair<std::array<unsigned_short,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
    ::
    pair<std::array<unsigned_short,_3UL>_&,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_&,_true>
              (&local_cc,&local_66,local_1c);
    _Var9 = std::
            unordered_map<std::array<unsigned_short,3ul>,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>,draco::HashArray<std::array<unsigned_short,3ul>>,std::equal_to<std::array<unsigned_short,3ul>>,std::allocator<std::pair<std::array<unsigned_short,3ul>const,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>>
            ::
            insert<std::pair<std::array<unsigned_short,3ul>,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>
                      (in_stack_fffffffffffffe90,
                       (pair<std::array<unsigned_short,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                        *)in_stack_fffffffffffffe88);
    in_stack_fffffffffffffeb8._M_cur =
         (__node_type *)
         _Var9.first.
         super__Node_iterator_base<std::pair<const_std::array<unsigned_short,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_true>
         ._M_cur;
    local_d8 = _Var9.second;
    in_stack_fffffffffffffeb4.value_ = CONCAT13(local_d8,(int3)in_stack_fffffffffffffeb4.value_);
    local_e0._M_cur = in_stack_fffffffffffffeb8._M_cur;
    local_c0._M_cur = in_stack_fffffffffffffeb8._M_cur;
    local_b8 = local_d8;
    std::
    tie<std::__detail::_Node_iterator<std::pair<std::array<unsigned_short,3ul>const,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>,false,true>,bool>
              (&in_stack_fffffffffffffe88->first,(bool *)in_stack_fffffffffffffe80);
    std::
    tuple<std::__detail::_Node_iterator<std::pair<std::array<unsigned_short,3ul>const,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>,false,true>&,bool&>
    ::operator=((tuple<std::__detail::_Node_iterator<std::pair<const_std::array<unsigned_short,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_false,_true>_&,_bool_&>
                 *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    if ((local_a9 & 1) == 0) {
      ppVar6 = std::__detail::
               _Node_iterator<std::pair<const_std::array<unsigned_short,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::array<unsigned_short,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_false,_true>
                             *)0x1bd93b);
      in_stack_fffffffffffffea0 = &ppVar6->second;
      in_stack_fffffffffffffea8 =
           (GeometryAttribute *)
           IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
           ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                         *)in_stack_fffffffffffffe80,
                        (IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                        in_stack_fffffffffffffe78);
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator=
                ((IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                 in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    }
    else {
      local_f4 = local_1c[0].value_;
      GeometryAttribute::SetAttributeValue
                (in_stack_fffffffffffffea8,in_stack_fffffffffffffeb4,in_stack_fffffffffffffea0);
      pvVar7 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
               ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                             *)in_stack_fffffffffffffe80,
                            (IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                            in_stack_fffffffffffffe78);
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator=(pvVar7,local_1c);
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator++(local_1c);
    }
    IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator++(local_90);
  }
  bVar1 = IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator==
                    (local_1c,&in_RDI->num_unique_entries_);
  if (bVar1) {
    local_4 = IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::value(local_1c);
  }
  else {
    bVar1 = is_mapping_identity(in_RDI);
    if (bVar1) {
      SetExplicitMapping(in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
      for (local_fc = 0; local_fc < in_RDI->num_unique_entries_; local_fc = local_fc + 1) {
        IndexType<unsigned_int,_draco::PointIndex_tag_type_>::IndexType(&local_100,local_fc);
        IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType
                  (&local_108,local_fc);
        pvVar7 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                 ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                               *)in_stack_fffffffffffffe80,
                              (IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                              in_stack_fffffffffffffe78);
        local_104 = pvVar7->value_;
        SetPointMapEntry(in_stack_fffffffffffffe78,
                         (PointIndex)(uint)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                         (AttributeValueIndex)(uint)in_stack_fffffffffffffe80);
      }
    }
    else {
      IndexType<unsigned_int,_draco::PointIndex_tag_type_>::IndexType(&local_10c,0);
      while( true ) {
        sVar8 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                ::size((IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                        *)0x1bdb5a);
        local_110 = (uint)sVar8;
        bVar1 = IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator<
                          (&local_10c,&local_110);
        if (!bVar1) break;
        IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
        ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                      *)in_stack_fffffffffffffe80,
                     (IndexType<unsigned_int,_draco::PointIndex_tag_type_> *)
                     in_stack_fffffffffffffe78);
        in_stack_fffffffffffffe80 =
             (PointAttribute *)
             IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
             ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                           *)in_stack_fffffffffffffe80,
                          (IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                          in_stack_fffffffffffffe78);
        SetPointMapEntry(in_stack_fffffffffffffe78,
                         (PointIndex)(uint)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                         (AttributeValueIndex)(uint)in_stack_fffffffffffffe80);
        IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator++(&local_10c);
      }
    }
    uVar2 = IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::value(local_1c);
    in_RDI->num_unique_entries_ = uVar2;
    local_4 = in_RDI->num_unique_entries_;
  }
  local_f8 = 1;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
  ::~IndexTypeVector((IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                      *)0x1bdc19);
  std::
  unordered_map<std::array<unsigned_short,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::HashArray<std::array<unsigned_short,_3UL>_>,_std::equal_to<std::array<unsigned_short,_3UL>_>,_std::allocator<std::pair<const_std::array<unsigned_short,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>_>
  ::~unordered_map((unordered_map<std::array<unsigned_short,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::HashArray<std::array<unsigned_short,_3UL>_>,_std::equal_to<std::array<unsigned_short,_3UL>_>,_std::allocator<std::pair<const_std::array<unsigned_short,_3UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>_>
                    *)0x1bdc26);
  return local_4;
}

Assistant:

AttributeValueIndex::ValueType PointAttribute::DeduplicateFormattedValues(
    const GeometryAttribute &in_att, AttributeValueIndex in_att_offset) {
  // We want to detect duplicates using a hash map but we cannot hash floating
  // point numbers directly so bit-copy floats to the same sized integers and
  // hash them.

  // First we need to determine which int type to use (1, 2, 4 or 8 bytes).
  // Note, this is done at compile time using std::conditional struct.
  // Conditional is in form <bool-expression, true, false>. If bool-expression
  // is true the "true" branch is used and vice versa. All at compile time.
  typedef conditional_t<sizeof(T) == 1, uint8_t,
                        conditional_t<sizeof(T) == 2, uint16_t,
                                      conditional_t<sizeof(T) == 4, uint32_t,
                                                    /*else*/ uint64_t>>>
      HashType;

  AttributeValueIndex unique_vals(0);
  typedef std::array<T, num_components_t> AttributeValue;
  typedef std::array<HashType, num_components_t> AttributeHashableValue;
  typedef unordered_map<AttributeHashableValue, AttributeValueIndex,
                        HashArray<AttributeHashableValue>>
      ValueToIndexMap;

  // Hash map storing index of the first attribute with a given value.
  ValueToIndexMap value_to_index_map;
  AttributeValue att_value;
  AttributeHashableValue hashable_value;
  IndexTypeVector<AttributeValueIndex, AttributeValueIndex> value_map(
      num_unique_entries_);
  for (AttributeValueIndex i(0); i < num_unique_entries_; ++i) {
    const AttributeValueIndex att_pos = i + in_att_offset;
    att_value = in_att.GetValue<T, num_components_t>(att_pos);
    // Convert the value to hashable type. Bit-copy real attributes to integers.
    memcpy(&(hashable_value[0]), &(att_value[0]), sizeof(att_value));

    typename ValueToIndexMap::iterator it;
    bool inserted;
    std::tie(it, inserted) = value_to_index_map.insert(
        std::pair<AttributeHashableValue, AttributeValueIndex>(hashable_value,
                                                               unique_vals));

    // Try to update the hash map with a new entry pointing to the latest unique
    // vertex index.
    if (!inserted) {
      // Duplicated value found. Update index mapping.
      value_map[i] = it->second;
    } else {
      // New unique value.
      SetAttributeValue(unique_vals, &att_value);
      // Update index mapping.
      value_map[i] = unique_vals;

      ++unique_vals;
    }
  }
  if (unique_vals == num_unique_entries_) {
    return unique_vals.value();  // Nothing has changed.
  }
  if (is_mapping_identity()) {
    // Change identity mapping to the explicit one.
    // The number of points is equal to the number of old unique values.
    SetExplicitMapping(num_unique_entries_);
    // Update the explicit map.
    for (uint32_t i = 0; i < num_unique_entries_; ++i) {
      SetPointMapEntry(PointIndex(i), value_map[AttributeValueIndex(i)]);
    }
  } else {
    // Update point to value map using the mapping between old and new values.
    for (PointIndex i(0); i < static_cast<uint32_t>(indices_map_.size()); ++i) {
      SetPointMapEntry(i, value_map[indices_map_[i]]);
    }
  }
  num_unique_entries_ = unique_vals.value();
  return num_unique_entries_;
}